

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QAuthenticator * __thiscall QAuthenticator::operator=(QAuthenticator *this,QAuthenticator *other)

{
  Data *pDVar1;
  QHash<QString,_QVariant> *in_RSI;
  QAuthenticatorPrivate *in_RDI;
  QAuthenticatorPrivate *this_00;
  QAuthenticatorPrivate *local_8;
  
  local_8 = in_RDI;
  if ((QAuthenticatorPrivate *)(in_RDI->user).d.d != (QAuthenticatorPrivate *)in_RSI->d) {
    this_00 = in_RDI;
    detach((QAuthenticator *)in_RDI);
    if (in_RSI->d == (Data *)0x0) {
      local_8 = in_RDI;
      if ((in_RDI->user).d.d[9].super_QArrayData.flags.
          super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
          super_QFlagsStorage<QArrayData::ArrayOption>.i == 0) {
        pDVar1 = (in_RDI->user).d.d;
        if (pDVar1 != (Data *)0x0) {
          QAuthenticatorPrivate::~QAuthenticatorPrivate(in_RDI);
          operator_delete(pDVar1,0xe8);
        }
        (in_RDI->user).d.d = (Data *)0x0;
        local_8 = in_RDI;
      }
    }
    else {
      QString::operator=((QString *)(in_RDI->user).d.d,(QString *)in_RSI->d);
      QString::operator=(&((QAuthenticatorPrivate *)(in_RDI->user).d.d)->userDomain,
                         (QString *)&in_RSI->d[5].size);
      QString::operator=(&((QAuthenticatorPrivate *)(in_RDI->user).d.d)->workstation,
                         (QString *)&in_RSI->d[4].seed);
      QString::operator=(&((QAuthenticatorPrivate *)(in_RDI->user).d.d)->extractedUser,
                         (QString *)&in_RSI->d->seed);
      QString::operator=(&((QAuthenticatorPrivate *)(in_RDI->user).d.d)->password,
                         (QString *)&in_RSI->d[1].size);
      QString::operator=(&((QAuthenticatorPrivate *)(in_RDI->user).d.d)->realm,
                         (QString *)&in_RSI->d[2].size);
      ((QAuthenticatorPrivate *)(in_RDI->user).d.d)->method =
           in_RSI->d[2].ref.atomic._q_value.super___atomic_base<int>._M_i;
      QHash<QString,_QVariant>::operator=((QHash<QString,_QVariant> *)this_00,in_RSI);
      local_8 = in_RDI;
    }
  }
  return (QAuthenticator *)local_8;
}

Assistant:

QAuthenticator &QAuthenticator::operator=(const QAuthenticator &other)
{
    if (d == other.d)
        return *this;

    // Do not share the d since challenge response/based changes
    // could corrupt the internal store and different network requests
    // can utilize different types of proxies.
    detach();
    if (other.d) {
        d->user = other.d->user;
        d->userDomain = other.d->userDomain;
        d->workstation = other.d->workstation;
        d->extractedUser = other.d->extractedUser;
        d->password = other.d->password;
        d->realm = other.d->realm;
        d->method = other.d->method;
        d->options = other.d->options;
    } else if (d->phase == QAuthenticatorPrivate::Start) {
        delete d;
        d = nullptr;
    }
    return *this;
}